

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42parse.c
# Opt level: O0

FT_Error t42_parse_dict(T42_Face face,T42_Loader loader,FT_Byte *base,FT_Long size)

{
  FT_Byte *pFVar1;
  FT_Byte *__s;
  int iVar2;
  uint uVar3;
  FT_Error FVar4;
  FT_Byte *pFVar5;
  size_t sVar6;
  FT_Byte *name;
  T1_Field keyword;
  int i;
  FT_UInt len;
  T1_TokenRec token;
  FT_Byte *cur2;
  FT_Byte *cur;
  FT_Int n_keywords;
  FT_Byte *limit;
  T42_Parser parser;
  FT_Long size_local;
  FT_Byte *base_local;
  T42_Loader loader_local;
  T42_Face face_local;
  
  (loader->parser).root.cursor = base;
  (loader->parser).root.limit = base + size;
  (loader->parser).root.error = 0;
  pFVar1 = (loader->parser).root.limit;
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  while ((loader->parser).root.cursor < pFVar1) {
    pFVar5 = (loader->parser).root.cursor;
    if (((*pFVar5 == 'F') && (pFVar5 + 0x19 < pFVar1)) &&
       (iVar2 = strncmp((char *)pFVar5,"FontDirectory",0xd), iVar2 == 0)) {
      (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
      (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
      token._16_8_ = (loader->parser).root.cursor;
      cur2 = (FT_Byte *)token._16_8_;
      while ((cur2 < pFVar1 &&
             (((*cur2 != 'k' || (pFVar1 <= cur2 + 5)) ||
              (iVar2 = strncmp((char *)cur2,"known",5), iVar2 != 0))))) {
        (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
        if ((loader->parser).root.error != 0) goto LAB_00353063;
        (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
        cur2 = (loader->parser).root.cursor;
      }
      if (cur2 < pFVar1) {
        (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
        (*(loader->parser).root.funcs.to_token)((PS_Parser)loader,(T1_Token)&i);
        if ((int)token.limit == 3) {
          token._16_8_ = (loader->parser).root.cursor;
        }
      }
      (loader->parser).root.cursor = (FT_Byte *)token._16_8_;
    }
    else if ((*pFVar5 == '/') && (pFVar5 + 2 < pFVar1)) {
      pFVar5 = pFVar5 + 1;
      (loader->parser).root.cursor = pFVar5;
      (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
      if ((loader->parser).root.error != 0) break;
      uVar3 = (int)(loader->parser).root.cursor - (int)pFVar5;
      if (((uVar3 != 0) && (uVar3 < 0x16)) && ((loader->parser).root.cursor < pFVar1)) {
        for (keyword._0_4_ = 0; (int)keyword < 0x14; keyword._0_4_ = (int)keyword + 1) {
          __s = (FT_Byte *)t42_keywords[(int)keyword].ident;
          if ((((__s != (FT_Byte *)0x0) && (*pFVar5 == *__s)) &&
              (sVar6 = strlen((char *)__s), uVar3 == sVar6)) &&
             (iVar2 = memcmp(pFVar5,__s,(ulong)uVar3), iVar2 == 0)) {
            FVar4 = t42_load_keyword(face,loader,t42_keywords + (int)keyword);
            (loader->parser).root.error = FVar4;
            if ((loader->parser).root.error != 0) {
              return (loader->parser).root.error;
            }
            break;
          }
        }
      }
    }
    else {
      (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
      if ((loader->parser).root.error != 0) break;
    }
    (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  }
LAB_00353063:
  return (loader->parser).root.error;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  t42_parse_dict( T42_Face    face,
                  T42_Loader  loader,
                  FT_Byte*    base,
                  FT_Long     size )
  {
    T42_Parser  parser     = &loader->parser;
    FT_Byte*    limit;
    FT_Int      n_keywords = (FT_Int)( sizeof ( t42_keywords ) /
                                         sizeof ( t42_keywords[0] ) );


    parser->root.cursor = base;
    parser->root.limit  = base + size;
    parser->root.error  = FT_Err_Ok;

    limit = parser->root.limit;

    T1_Skip_Spaces( parser );

    while ( parser->root.cursor < limit )
    {
      FT_Byte*  cur;


      cur = parser->root.cursor;

      /* look for `FontDirectory' which causes problems for some fonts */
      if ( *cur == 'F' && cur + 25 < limit                    &&
           ft_strncmp( (char*)cur, "FontDirectory", 13 ) == 0 )
      {
        FT_Byte*  cur2;


        /* skip the `FontDirectory' keyword */
        T1_Skip_PS_Token( parser );
        T1_Skip_Spaces  ( parser );
        cur = cur2 = parser->root.cursor;

        /* look up the `known' keyword */
        while ( cur < limit )
        {
          if ( *cur == 'k' && cur + 5 < limit             &&
                ft_strncmp( (char*)cur, "known", 5 ) == 0 )
            break;

          T1_Skip_PS_Token( parser );
          if ( parser->root.error )
            goto Exit;
          T1_Skip_Spaces  ( parser );
          cur = parser->root.cursor;
        }

        if ( cur < limit )
        {
          T1_TokenRec  token;


          /* skip the `known' keyword and the token following it */
          T1_Skip_PS_Token( parser );
          T1_ToToken( parser, &token );

          /* if the last token was an array, skip it! */
          if ( token.type == T1_TOKEN_TYPE_ARRAY )
            cur2 = parser->root.cursor;
        }
        parser->root.cursor = cur2;
      }

      /* look for immediates */
      else if ( *cur == '/' && cur + 2 < limit )
      {
        FT_UInt  len;


        cur++;

        parser->root.cursor = cur;
        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;

        len = (FT_UInt)( parser->root.cursor - cur );

        if ( len > 0 && len < 22 && parser->root.cursor < limit )
        {
          int  i;


          /* now compare the immediate name to the keyword table */

          /* loop through all known keywords */
          for ( i = 0; i < n_keywords; i++ )
          {
            T1_Field  keyword = (T1_Field)&t42_keywords[i];
            FT_Byte   *name   = (FT_Byte*)keyword->ident;


            if ( !name )
              continue;

            if ( cur[0] == name[0]                      &&
                 len == ft_strlen( (const char *)name ) &&
                 ft_memcmp( cur, name, len ) == 0       )
            {
              /* we found it -- run the parsing callback! */
              parser->root.error = t42_load_keyword( face,
                                                     loader,
                                                     keyword );
              if ( parser->root.error )
                return parser->root.error;
              break;
            }
          }
        }
      }
      else
      {
        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;
      }

      T1_Skip_Spaces( parser );
    }

  Exit:
    return parser->root.error;
  }